

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O3

Flag __thiscall
Js::ConfigFlagsTable::GetNextChildFlag(ConfigFlagsTable *this,Flag parentFlag,Flag currentChildFlag)

{
  uint uVar1;
  ulong uVar2;
  undefined6 in_register_00000012;
  
  uVar1 = 0;
  if (1 < (ushort)(currentChildFlag - InvalidFlag)) {
    uVar1 = (int)CONCAT62(in_register_00000012,currentChildFlag) + 1;
  }
  if (uVar1 < 0x1d6) {
    uVar2 = (ulong)uVar1;
    do {
      if ((&FlagParents)[uVar2] == parentFlag) {
        return (Flag)uVar2;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != 0x1d6);
  }
  return InvalidFlag;
}

Assistant:

Flag
    ConfigFlagsTable::GetNextChildFlag(Flag parentFlag, Flag currentChildFlag)  const
    {
        // start at the current+1
        int startIndex = (int)currentChildFlag + 1;

        // otherwise start from beginning
        if (currentChildFlag == InvalidFlag || currentChildFlag == NoParentFlag)
        {
            // reset the start index
            startIndex = 0;
        }

        for(int i=startIndex; i < FlagCount; i++)
        {
            Flag currentFlag = (Flag)i;
            Flag parentFlagForCurrentFlag = GetParentFlag(currentFlag);

            if(parentFlagForCurrentFlag == parentFlag)
            {
                // found a match
                return currentFlag;
            }
        }

        // no more
        return InvalidFlag;
    }